

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

uint32_t __thiscall tinyusdz::primvar::PrimVar::type_id(PrimVar *this)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  
  bVar2 = is_valid(this);
  if (!bVar2) {
    return 0;
  }
  if ((this->_blocked == false) &&
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar3 = (*pvVar1->type_id)(), uVar3 == 0)) ||
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) {
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      return 0;
    }
    uVar3 = tinyusdz::value::TimeSamples::type_id(&this->_ts);
    return uVar3;
  }
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    return 2;
  }
  uVar3 = (*pvVar1->type_id)();
  return uVar3;
}

Assistant:

uint32_t type_id() const {
    if (!is_valid()) {
      return value::TYPE_ID_INVALID;
    }

    if (has_default()) {
      return _value.type_id();
    }

    if (has_timesamples()) {
      return _ts.type_id();
    }

    return value::TypeId::TYPE_ID_INVALID;

  }